

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O3

void chrono::utils::WriteCamera
               (string *filename,ChVector<double> *cam_location,ChVector<double> *cam_target,
               ChVector<double> *camera_upvec,string *delim)

{
  char cVar1;
  ostream *poVar2;
  CSV_writer csv;
  string local_1e0;
  CSV_writer local_1c0;
  
  CSV_writer::CSV_writer(&local_1c0,delim);
  cVar1 = (char)&local_1c0 + ' ';
  poVar2 = std::ostream::_M_insert<double>(cam_location->m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0.m_delim._M_dataplus._M_p,local_1c0.m_delim._M_string_length);
  poVar2 = std::ostream::_M_insert<double>(cam_location->m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0.m_delim._M_dataplus._M_p,local_1c0.m_delim._M_string_length);
  poVar2 = std::ostream::_M_insert<double>(cam_location->m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0.m_delim._M_dataplus._M_p,local_1c0.m_delim._M_string_length);
  std::ios::widen((char)*(undefined8 *)(local_1c0._32_8_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<double>(cam_target->m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0.m_delim._M_dataplus._M_p,local_1c0.m_delim._M_string_length);
  poVar2 = std::ostream::_M_insert<double>(cam_target->m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0.m_delim._M_dataplus._M_p,local_1c0.m_delim._M_string_length);
  poVar2 = std::ostream::_M_insert<double>(cam_target->m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0.m_delim._M_dataplus._M_p,local_1c0.m_delim._M_string_length);
  std::ios::widen((char)*(undefined8 *)(local_1c0._32_8_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  poVar2 = std::ostream::_M_insert<double>(camera_upvec->m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0.m_delim._M_dataplus._M_p,local_1c0.m_delim._M_string_length);
  poVar2 = std::ostream::_M_insert<double>(camera_upvec->m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0.m_delim._M_dataplus._M_p,local_1c0.m_delim._M_string_length);
  poVar2 = std::ostream::_M_insert<double>(camera_upvec->m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0.m_delim._M_dataplus._M_p,local_1c0.m_delim._M_string_length);
  std::ios::widen((char)*(undefined8 *)(local_1c0._32_8_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
  CSV_writer::write_to_file(&local_1c0,filename,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  CSV_writer::~CSV_writer(&local_1c0);
  return;
}

Assistant:

void WriteCamera(const std::string& filename,
                 const ChVector<>& cam_location,
                 const ChVector<>& cam_target,
                 const ChVector<>& camera_upvec,
                 const std::string& delim) {
    CSV_writer csv(delim);
    csv << cam_location << std::endl;
    csv << cam_target << std::endl;
    csv << camera_upvec << std::endl;
    csv.write_to_file(filename);
}